

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O3

REF_STATUS
ref_cell_node_list_around
          (REF_CELL ref_cell,REF_INT node,REF_INT max_node,REF_INT *nnode,REF_INT *node_list)

{
  int iVar1;
  int iVar2;
  REF_ADJ pRVar3;
  REF_INT *pRVar4;
  REF_ADJ_ITEM pRVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  REF_INT RVar9;
  ulong uVar10;
  
  *nnode = 0;
  if (((node < 0) || (pRVar3 = ref_cell->ref_adj, pRVar3->nnode <= node)) ||
     (lVar6 = (long)pRVar3->first[(uint)node], lVar6 == -1)) {
    return 0;
  }
  pRVar5 = pRVar3->item + lVar6;
  RVar9 = ref_cell->node_per;
  uVar8 = 0;
  do {
    if (0 < RVar9) {
      iVar1 = pRVar5->ref;
      pRVar4 = ref_cell->c2n;
      iVar7 = 0;
      do {
        iVar2 = pRVar4[ref_cell->size_per * iVar1 + iVar7];
        if (iVar2 != node) {
          if (0 < (int)uVar8) {
            uVar10 = 0;
            do {
              if (node_list[uVar10] == iVar2) goto LAB_001130e5;
              uVar10 = uVar10 + 1;
            } while (uVar8 != uVar10);
          }
          if (max_node <= (int)uVar8) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                   0x4e8,"ref_cell_node_list_around",7,"max_node too small");
            return 7;
          }
          node_list[(int)uVar8] = iVar2;
          uVar8 = *nnode + 1;
          *nnode = uVar8;
          RVar9 = ref_cell->node_per;
        }
LAB_001130e5:
        iVar7 = iVar7 + 1;
      } while (iVar7 < RVar9);
    }
    pRVar5 = ref_cell->ref_adj->item;
    lVar6 = (long)pRVar5[(int)lVar6].next;
    if (lVar6 == -1) {
      return 0;
    }
    pRVar5 = pRVar5 + lVar6;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_cell_node_list_around(REF_CELL ref_cell, REF_INT node,
                                             REF_INT max_node, REF_INT *nnode,
                                             REF_INT *node_list) {
  REF_INT cell, item, cell_node, haves;
  REF_BOOL already_have_it;

  *nnode = 0;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      if (node == ref_cell_c2n(ref_cell, cell_node, cell)) continue;
      already_have_it = REF_FALSE;
      for (haves = 0; haves < *nnode; haves++)
        if (node_list[haves] == ref_cell_c2n(ref_cell, cell_node, cell)) {
          already_have_it = REF_TRUE;
          break;
        }
      if (!already_have_it) {
        if (*nnode >= max_node) {
          RSS(REF_INCREASE_LIMIT, "max_node too small");
        }
        node_list[*nnode] = ref_cell_c2n(ref_cell, cell_node, cell);
        (*nnode)++;
      }
    }
  }

  return REF_SUCCESS;
}